

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# endian-util.c
# Opt level: O3

uint16_t read_le16(uchar **buffer)

{
  uint16_t uVar1;
  
  uVar1 = *(uint16_t *)*buffer;
  *buffer = (uchar *)((long)*buffer + 2);
  return uVar1;
}

Assistant:

uint16_t read_le16(unsigned char **buffer)
{
	uint8_t b1, b2;
	b1 = *(uint8_t *)(*buffer);
	b2 = *(uint8_t *)(*buffer + 1);
	uint16_t result = (b1 << 0) | (b2 << 8);
	(*buffer) += 2;
	return result;
}